

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void KillServerHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  ostream *poVar1;
  _KillResponseMsg kill_response_msg;
  stringstream Status;
  ulong local_1f8;
  char *pcStack_1f0;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  pcStack_1f0 = (char *)0x0;
  local_1f8 = (ulong)*vevent;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"ADIOS files Opened: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," gets for ");
  readable_size_abi_cxx11_(&local_1e8,TotalGetBytesSent);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = std::operator<<(poVar1,")  Simple files opened: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," reads for ");
  readable_size_abi_cxx11_(&local_1c8,TotalSimpleBytesSent);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringbuf::str();
  pcStack_1f0 = strdup(local_1e8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1e8);
  CMwrite(conn,*(undefined8 *)((long)client_data + 0x50),&local_1f8);
  free(pcStack_1f0);
  exit(0);
}

Assistant:

static void KillServerHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                              attr_list attrs)
{
    KillServerMsg kill_msg = static_cast<KillServerMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _KillResponseMsg kill_response_msg;
    memset(&kill_response_msg, 0, sizeof(kill_response_msg));
    kill_response_msg.KillResponseCondition = kill_msg->KillResponseCondition;
    std::stringstream Status;
    Status << "ADIOS files Opened: " << ADIOSFilesOpened << " (" << TotalGets << " gets for "
           << readable_size(TotalGetBytesSent) << ")  Simple files opened: " << SimpleFilesOpened
           << " (" << TotalSimpleReads << " reads for " << readable_size(TotalSimpleBytesSent)
           << ")";
    kill_response_msg.Status = strdup(Status.str().c_str());
    CMwrite(conn, ev_state->KillResponseFormat, &kill_response_msg);
    free(kill_response_msg.Status);
    exit(0);
}